

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContextInit.cpp
# Opt level: O2

int64_t Imf_3_4::ostream_write
                  (exr_const_context_t ctxt,void *userdata,void *buffer,uint64_t sz,uint64_t offset,
                  exr_stream_error_func_ptr_t error_cb)

{
  uint64_t uVar1;
  long lVar2;
  int64_t iVar3;
  
  if (sz >> 0x1f != 0) {
    (*error_cb)(ctxt,10,"Stream interface request to write block too large");
    return -1;
  }
  std::mutex::lock((mutex *)userdata);
  if (*(uint64_t *)((long)userdata + 0x28) != offset) {
    (**(code **)(**(long **)((long)userdata + 0x30) + 0x20))
              (*(long **)((long)userdata + 0x30),offset);
    uVar1 = (**(code **)(**(long **)((long)userdata + 0x30) + 0x18))();
    *(uint64_t *)((long)userdata + 0x28) = uVar1;
    if (uVar1 != offset) {
      (*error_cb)(ctxt,10,"Unable to seek to desired offset %lu",offset);
      iVar3 = -1;
      goto LAB_00165a5e;
    }
  }
  (**(code **)(**(long **)((long)userdata + 0x30) + 0x10))
            (*(long **)((long)userdata + 0x30),buffer,sz & 0xffffffff);
  lVar2 = (**(code **)(**(long **)((long)userdata + 0x30) + 0x18))();
  *(long *)((long)userdata + 0x28) = lVar2;
  iVar3 = lVar2 - offset;
LAB_00165a5e:
  pthread_mutex_unlock((pthread_mutex_t *)userdata);
  return iVar3;
}

Assistant:

static int64_t
ostream_write (
    exr_const_context_t         ctxt,
    void*                       userdata,
    const void*                 buffer,
    uint64_t                    sz,
    uint64_t                    offset,
    exr_stream_error_func_ptr_t error_cb)
{
    ostream_holder* oh = static_cast<ostream_holder*> (userdata);

    if (sz > INT_MAX)
    {
        error_cb (
            ctxt,
            EXR_ERR_READ_IO,
            "Stream interface request to write block too large");
        return -1;
    }

#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lk{oh->_mx};
#endif

    if (offset != oh->_cur_offset)
    {
        oh->_stream->seekp (offset);
        oh->_cur_offset = oh->_stream->tellp ();
        if (offset != oh->_cur_offset)
        {
            error_cb (
                ctxt,
                EXR_ERR_READ_IO,
                "Unable to seek to desired offset %" PRIu64,
                offset);
            return -1;
        }
    }

    int64_t nwrite = oh->_cur_offset;
    try
    {
        oh->_stream->write (
            static_cast<const char*> (buffer), static_cast<int> (sz));
        oh->_cur_offset = oh->_stream->tellp ();
        nwrite          = oh->_cur_offset - nwrite;
    }
    catch (...)
    {
        error_cb (
            ctxt,
            EXR_ERR_READ_IO,
            "Unable to seek to desired offset %" PRIu64,
            offset);
        nwrite = -1;
    }
    return nwrite;
}